

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.h
# Opt level: O1

type __thiscall
llvm::yaml::
yamlize<std::vector<llvm::yaml::Hex8,std::allocator<llvm::yaml::Hex8>>,llvm::yaml::EmptyContext>
          (yaml *this,IO *io,vector<llvm::yaml::Hex8,_std::allocator<llvm::yaml::Hex8>_> *Seq,
          bool param_3,EmptyContext *Ctx)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  undefined7 in_register_00000009;
  ulong uVar4;
  undefined8 local_40;
  void *SaveInfo;
  
  SaveInfo = (void *)CONCAT71(in_register_00000009,param_3);
  uVar2 = (**(code **)(*(long *)this + 0x40))();
  cVar1 = (**(code **)(*(long *)this + 0x10))(this);
  uVar3 = *(int *)&io->Ctxt - *(int *)&io->_vptr_IO;
  if (cVar1 == '\0') {
    uVar3 = uVar2;
  }
  if (uVar3 != 0) {
    uVar4 = 0;
    do {
      cVar1 = (**(code **)(*(long *)this + 0x48))(this,uVar4 & 0xffffffff,&local_40);
      if (cVar1 != '\0') {
        if ((ulong)((long)io->Ctxt - (long)io->_vptr_IO) <= uVar4) {
          std::vector<llvm::yaml::Hex8,_std::allocator<llvm::yaml::Hex8>_>::resize
                    ((vector<llvm::yaml::Hex8,_std::allocator<llvm::yaml::Hex8>_> *)io,uVar4 + 1);
        }
        yamlize<llvm::yaml::Hex8>
                  ((IO *)this,(Hex8 *)((long)io->_vptr_IO + uVar4),true,(EmptyContext *)SaveInfo);
        (**(code **)(*(long *)this + 0x50))(this,local_40);
      }
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
  }
  (**(code **)(*(long *)this + 0x58))(this);
  return;
}

Assistant:

typename std::enable_if<has_SequenceTraits<T>::value, void>::type
yamlize(IO &io, T &Seq, bool, Context &Ctx) {
  if ( has_FlowTraits< SequenceTraits<T>>::value ) {
    unsigned incnt = io.beginFlowSequence();
    unsigned count = io.outputting() ? SequenceTraits<T>::size(io, Seq) : incnt;
    for(unsigned i=0; i < count; ++i) {
      void *SaveInfo;
      if ( io.preflightFlowElement(i, SaveInfo) ) {
        yamlize(io, SequenceTraits<T>::element(io, Seq, i), true, Ctx);
        io.postflightFlowElement(SaveInfo);
      }
    }
    io.endFlowSequence();
  }
  else {
    unsigned incnt = io.beginSequence();
    unsigned count = io.outputting() ? SequenceTraits<T>::size(io, Seq) : incnt;
    for(unsigned i=0; i < count; ++i) {
      void *SaveInfo;
      if ( io.preflightElement(i, SaveInfo) ) {
        yamlize(io, SequenceTraits<T>::element(io, Seq, i), true, Ctx);
        io.postflightElement(SaveInfo);
      }
    }
    io.endSequence();
  }
}